

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O0

qm_val_t *
av1_get_qmatrix(CommonQuantParams *quant_params,MACROBLOCKD *xd,int plane,TX_SIZE tx_size,
               TX_TYPE tx_type)

{
  undefined2 uVar1;
  byte bVar2;
  _Bool _Var3;
  TX_SIZE in_CL;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  TX_TYPE in_R8B;
  TX_SIZE qm_tx_size;
  int seg_id;
  MB_MODE_INFO *mbmi;
  macroblockd_plane *pd;
  undefined8 local_38;
  
  uVar1 = *(undefined2 *)(**(long **)(in_RSI + 0x1eb8) + 0xa7);
  bVar2 = av1_get_adjusted_tx_size(in_CL);
  _Var3 = is_2d_transform(in_R8B);
  if (_Var3) {
    local_38 = *(qm_val_t **)
                (in_RSI + (long)in_EDX * 0xa30 + 0x580 + (long)(int)(uint)((byte)uVar1 & 7) * 0x98 +
                (ulong)bVar2 * 8);
  }
  else {
    local_38 = *(qm_val_t **)(in_RDI + 0x37b8 + (ulong)bVar2 * 8);
  }
  return local_38;
}

Assistant:

const qm_val_t *av1_get_qmatrix(const CommonQuantParams *quant_params,
                                const MACROBLOCKD *xd, int plane,
                                TX_SIZE tx_size, TX_TYPE tx_type) {
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int seg_id = mbmi->segment_id;
  const TX_SIZE qm_tx_size = av1_get_adjusted_tx_size(tx_size);
  // Use a flat matrix (i.e. no weighting) for 1D and Identity transforms
  return is_2d_transform(tx_type)
             ? pd->seg_qmatrix[seg_id][qm_tx_size]
             : quant_params->gqmatrix[NUM_QM_LEVELS - 1][0][qm_tx_size];
}